

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zetMetricGroupCreateExp
          (zet_device_handle_t hDevice,char *pName,char *pDescription,
          zet_metric_group_sampling_type_flags_t samplingType,
          zet_metric_group_handle_t *phMetricGroup)

{
  Logger *this;
  long *plVar1;
  zet_metric_group_handle_t *pp_Var2;
  ze_result_t result;
  ze_result_t zVar3;
  long lVar4;
  size_t i;
  long lVar5;
  long lVar6;
  allocator local_69;
  zet_metric_group_handle_t *local_68;
  zet_device_handle_t local_60;
  code *local_58;
  string local_50;
  
  lVar6 = context;
  this = *(Logger **)(context + 0xd50);
  local_68 = phMetricGroup;
  local_60 = hDevice;
  std::__cxx11::string::string
            ((string *)&local_50,
             "zetMetricGroupCreateExp(hDevice, pName, pDescription, samplingType, phMetricGroup)",
             &local_69);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar6 + 0x790) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar4 = *(long *)(lVar6 + 0xd38) - *(long *)(lVar6 + 0xd30) >> 3;
    lVar5 = 0;
    local_58 = *(code **)(lVar6 + 0x790);
    do {
      if (lVar4 == lVar5) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZETHandleLifetimeValidation::zetMetricGroupCreateExpPrologue
                               ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                                local_60,pName,pDescription,samplingType,local_68),
           result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(local_60,pName,pDescription,samplingType,local_68);
          lVar6 = 0;
          goto LAB_00165d26;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 0x10);
      result = (**(code **)(*plVar1 + 0x3f0))
                         (plVar1,local_60,pName,pDescription,samplingType,local_68);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00165d6b;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar6 * 8) + 0x10);
    result = (**(code **)(*plVar1 + 0x3f8))
                       (plVar1,local_60,pName,pDescription,samplingType,local_68,zVar3);
    lVar6 = lVar6 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00165d26:
    pp_Var2 = local_68;
    lVar5 = context;
    if (lVar4 == lVar6) {
      result = zVar3;
      if (((zVar3 == ZE_RESULT_SUCCESS) && (local_68 != (zet_metric_group_handle_t *)0x0)) &&
         (*(char *)(context + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(context + 0xd48),*local_68);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar5 + 0xd48),local_60,*pp_Var2);
      }
      break;
    }
  }
LAB_00165d6b:
  logAndPropagateResult("zetMetricGroupCreateExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCreateExp(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        const char* pName,                              ///< [in] pointer to metric group name. Must point to a null-terminated
                                                        ///< character array no longer than ::ZET_MAX_METRIC_GROUP_NAME.
        const char* pDescription,                       ///< [in] pointer to metric group description. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_GROUP_DESCRIPTION.
        zet_metric_group_sampling_type_flags_t samplingType,///< [in] Sampling type for the metric group.
        zet_metric_group_handle_t* phMetricGroup        ///< [in,out] Created Metric group handle
        )
    {
        context.logger->log_trace("zetMetricGroupCreateExp(hDevice, pName, pDescription, samplingType, phMetricGroup)");

        auto pfnCreateExp = context.zetDdiTable.MetricGroupExp.pfnCreateExp;

        if( nullptr == pfnCreateExp )
            return logAndPropagateResult("zetMetricGroupCreateExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricGroupCreateExpPrologue( hDevice, pName, pDescription, samplingType, phMetricGroup );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupCreateExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetMetricGroupCreateExpPrologue( hDevice, pName, pDescription, samplingType, phMetricGroup );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupCreateExp", result);
        }

        auto driver_result = pfnCreateExp( hDevice, pName, pDescription, samplingType, phMetricGroup );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricGroupCreateExpEpilogue( hDevice, pName, pDescription, samplingType, phMetricGroup ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupCreateExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phMetricGroup){
                context.handleLifetime->addHandle( *phMetricGroup );
                context.handleLifetime->addDependent( hDevice, *phMetricGroup );

            }
        }
        return logAndPropagateResult("zetMetricGroupCreateExp", driver_result);
    }